

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O2

void wake_waiters(nsync_dll_list_ to_wake_list,int all_readers)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  uint *puVar6;
  lock_type *plVar7;
  bool bVar8;
  nsync_dll_element_ *pnVar9;
  nsync_dll_element_ *pnVar10;
  nsync_dll_list_ pnVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  
  pnVar9 = nsync_dll_first_(to_wake_list);
  pvVar5 = pnVar9->container;
  if (((*(byte *)((long)pvVar5 + 0x30) & 1) != 0) &&
     (puVar6 = *(uint **)((long)pvVar5 + 0x38), puVar6 != (uint *)0x0)) {
    uVar3 = *puVar6;
    uVar4 = **(uint **)((long)pvVar5 + 0x40);
    pnVar10 = nsync_dll_next_(to_wake_list,pnVar9);
    if (((char)((uVar3 & 2) >> 1) == '\0' && (uVar3 & 0xffffff01) != 0) &&
       (((uVar4 & uVar3) != 0 || (all_readers == 0 && pnVar10 != (nsync_dll_element_ *)0x0)))) {
      LOCK();
      uVar1 = *puVar6;
      if (uVar3 == uVar1) {
        *puVar6 = uVar3 & 0xffffff79 | 6;
      }
      UNLOCK();
      if (uVar3 == uVar1) {
        plVar7 = *(lock_type **)((long)pvVar5 + 0x40);
        bVar12 = plVar7 == nsync_writer_type_;
        if ((uVar4 & uVar3) == 0) {
          bVar13 = false;
          bVar14 = plVar7 != nsync_writer_type_;
        }
        else {
          bVar13 = plVar7 == nsync_writer_type_;
          to_wake_list = nsync_dll_remove_(to_wake_list,pnVar9);
          pnVar11 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(puVar6 + 2),pnVar9);
          *(nsync_dll_list_ *)(puVar6 + 2) = pnVar11;
          *(undefined8 *)((long)pvVar5 + 0x38) = 0;
          bVar12 = true;
          bVar14 = false;
        }
        while (bVar8 = bVar14, pnVar9 = pnVar10, pnVar9 != (nsync_dll_element_ *)0x0) {
          pvVar5 = pnVar9->container;
          bVar2 = *(byte *)((long)pvVar5 + 0x30);
          pnVar10 = nsync_dll_next_(to_wake_list,pnVar9);
          bVar14 = bVar8;
          if ((bVar2 & 1) != 0) {
            plVar7 = *(lock_type **)((long)pnVar9->container + 0x40);
            bVar14 = true;
            if ((bool)(plVar7 == nsync_writer_type_ | bVar12)) {
              bVar14 = plVar7 == nsync_writer_type_;
              to_wake_list = nsync_dll_remove_(to_wake_list,pnVar9);
              pnVar11 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(puVar6 + 2),pnVar9);
              *(nsync_dll_list_ *)(puVar6 + 2) = pnVar11;
              *(undefined8 *)((long)pvVar5 + 0x38) = 0;
              bVar13 = bVar13 || bVar14;
              bVar14 = bVar8;
            }
          }
        }
        do {
          uVar4 = *puVar6;
          LOCK();
          uVar3 = *puVar6;
          if (uVar4 == uVar3) {
            *puVar6 = uVar4 & 0xfffffffd | (uint)(!bVar8 && bVar13) << 5;
          }
          UNLOCK();
        } while (uVar4 != uVar3);
      }
    }
  }
  pnVar9 = nsync_dll_first_(to_wake_list);
  while (pnVar9 != (nsync_dll_element_ *)0x0) {
    pvVar5 = pnVar9->container;
    pnVar10 = nsync_dll_next_(to_wake_list,pnVar9);
    to_wake_list = nsync_dll_remove_(to_wake_list,pnVar9);
    *(undefined4 *)((long)pvVar5 + 0x20) = 0;
    nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar5 + 0x28));
    pnVar9 = pnVar10;
  }
  return;
}

Assistant:

static void wake_waiters (nsync_dll_list_ to_wake_list, int all_readers) {
	nsync_dll_element_ *p = NULL;
	nsync_dll_element_ *next = NULL;
	nsync_dll_element_ *first_waiter = nsync_dll_first_ (to_wake_list);
	struct nsync_waiter_s *first_nw = DLL_NSYNC_WAITER (first_waiter);
	waiter *first_w = NULL;
	nsync_mu *pmu = NULL;
	if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
		first_w = DLL_WAITER (first_waiter);
		pmu = first_w->cv_mu;
	}
	if (pmu != NULL) { /* waiter is associated with the nsync_mu *pmu. */
		/* We will transfer elements of to_wake_list to *pmu if all of:
		    - some thread holds the lock, and
		    - *pmu's spinlock is not held, and
		    - either *pmu cannot be acquired in the mode of the first
		      waiter, or there's more than one thread on to_wake_list
		      and not all are readers, and
		    - we acquire the spinlock on the first try.
		   The spinlock acquisition also marks *pmu as having waiters.
		   The requirement that some thread holds the lock ensures
		   that at least one of the transferred waiters will be woken.
		   */
		uint32_t old_mu_word = ATM_LOAD (&pmu->word);
		int first_cant_acquire = ((old_mu_word & first_w->l_type->zero_to_acquire) != 0);
		next = nsync_dll_next_ (to_wake_list, first_waiter);
		if ((old_mu_word&MU_ANY_LOCK) != 0 &&
		    (old_mu_word&MU_SPINLOCK) == 0 &&
		    (first_cant_acquire || (next != NULL && !all_readers)) &&
		    ATM_CAS_ACQ (&pmu->word, old_mu_word,
				 (old_mu_word|MU_SPINLOCK|MU_WAITING) &
				 ~MU_ALL_FALSE)) {

			uint32_t set_on_release = 0;

			/* For any waiter that should be transferred, rather
			   than woken, move it from to_wake_list to pmu->waiters. */
			int first_is_writer = first_w->l_type == nsync_writer_type_;
			int transferred_a_writer = 0;
			int woke_areader = 0;
			/* Transfer the first waiter iff it can't acquire *pmu. */
			if (first_cant_acquire) {
				to_wake_list = nsync_dll_remove_ (to_wake_list, first_waiter);
				pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, first_waiter);
				/* tell nsync_cv_wait_with_deadline() that we
				   moved the waiter to *pmu's queue.  */
				first_w->cv_mu = NULL;
				/* first_nw.waiting is already 1, from being on
				   cv's waiter queue.  */
				transferred_a_writer = first_is_writer;
			} else {
				woke_areader = !first_is_writer;
			}
			/* Now process the other waiters. */
			for (p = next; p != NULL; p = next) {
				int p_is_writer;
				struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
				waiter *p_w = NULL;
				if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
					p_w = DLL_WAITER (p);
				}
				next = nsync_dll_next_ (to_wake_list, p);
				p_is_writer = (p_w != NULL &&
					       DLL_WAITER (p)->l_type == nsync_writer_type_);
				/* We transfer this element if any of:
				   - the first waiter can't acquire *pmu, or
				   - the first waiter is a writer, or
				   - this element is a writer. */
				if (p_w == NULL) {
					/* wake non-native waiter */
				} else if (first_cant_acquire || first_is_writer || p_is_writer) {
					to_wake_list = nsync_dll_remove_ (to_wake_list, p);
					pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, p);
					/* tell nsync_cv_wait_with_deadline()
					   that we moved the waiter to *pmu's
					   queue.  */
					p_w->cv_mu = NULL;
					/* p_nw->waiting is already 1, from
					   being on cv's waiter queue.  */
					transferred_a_writer = transferred_a_writer || p_is_writer;
				} else {
					woke_areader = woke_areader || !p_is_writer;
				}
			}

			/* Claim a waiting writer if we transferred one, except if we woke readers,
			   in which case we want those readers to be able to acquire immediately. */
			if (transferred_a_writer && !woke_areader) {
				set_on_release |= MU_WRITER_WAITING;
			}

			/* release *pmu's spinlock  (MU_WAITING was set by CAS above) */
			old_mu_word = ATM_LOAD (&pmu->word);
			while (!ATM_CAS_REL (&pmu->word, old_mu_word,
					     (old_mu_word|set_on_release) & ~MU_SPINLOCK)) {
				old_mu_word = ATM_LOAD (&pmu->word);
			}
		}
	}

	/* Wake any waiters we didn't manage to enqueue on the mu. */
	for (p = nsync_dll_first_ (to_wake_list); p != NULL; p = next) {
		struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
		next = nsync_dll_next_ (to_wake_list, p);
		to_wake_list = nsync_dll_remove_ (to_wake_list, p);
		/* Wake the waiter. */
		ATM_STORE_REL (&p_nw->waiting, 0); /* release store */
		nsync_mu_semaphore_v (p_nw->sem);
	}
}